

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::opPtrsub(PrintC *this,PcodeOp *op)

{
  bool bVar1;
  type_metatype tVar2;
  uint4 ws;
  int4 iVar3;
  uint uVar4;
  HighVariable *this_00;
  LowlevelError *pLVar5;
  Varnode *pVVar6;
  uintb uVar7;
  ostream *this_01;
  void *this_02;
  Varnode *this_03;
  Symbol *pSVar8;
  Address *this_04;
  uintb uVar9;
  allocator local_3c9;
  string local_3c8 [38];
  undefined1 local_3a2;
  allocator local_3a1;
  string local_3a0 [36];
  uint local_37c;
  Datatype *pDStack_378;
  int4 off;
  Datatype *ct_1;
  SymbolEntry *local_360;
  SymbolEntry *entry;
  string local_350 [32];
  undefined1 local_330 [8];
  Address addr;
  Scope *scope;
  TypeSpacebase *sb;
  Atom local_2e8;
  Atom local_2c0;
  Atom local_298;
  string local_270 [32];
  ostringstream local_250 [8];
  ostringstream s;
  allocator local_d1;
  string local_d0 [32];
  TypeField *local_b0;
  TypeField *fld;
  int4 newoff;
  int4 fieldoffset;
  Datatype *fieldtype;
  string fieldname;
  int4 local_78;
  uintb suboff;
  allocator local_59;
  string local_58 [32];
  uint local_38;
  byte local_33;
  byte local_32;
  byte local_31;
  uint4 m;
  bool arrayvalue;
  bool flex;
  bool valueon;
  Varnode *in0;
  Datatype *ct;
  TypePointer *ptype;
  PcodeOp *op_local;
  PrintC *this_local;
  
  ptype = (TypePointer *)op;
  op_local = (PcodeOp *)this;
  _m = PcodeOp::getIn(op,0);
  this_00 = Varnode::getHigh(_m);
  ct = HighVariable::getType(this_00);
  tVar2 = Datatype::getMetatype(ct);
  if (tVar2 != TYPE_PTR) {
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])();
    pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"PTRSUB off of non-pointer type",&local_59);
    LowlevelError::LowlevelError(pLVar5,(string *)local_58);
    __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  in0 = (Varnode *)TypePointer::getPtrTo((TypePointer *)ct);
  local_38 = (this->super_PrintLanguage).mods & 0xffffff9f;
  local_31 = ((this->super_PrintLanguage).mods & 0x60) != 0;
  local_32 = isValueFlexible(_m);
  tVar2 = Datatype::getMetatype((Datatype *)in0);
  if (tVar2 == TYPE_STRUCT) {
    pVVar6 = PcodeOp::getIn((PcodeOp *)ptype,1);
    uVar7 = Varnode::getOffset(pVVar6);
    ws = TypePointer::getWordSize((TypePointer *)ct);
    uVar7 = AddrSpace::addressToByte(uVar7,ws);
    std::__cxx11::string::string((string *)&fieldtype);
    local_78 = (int4)uVar7;
    local_b0 = TypeStruct::getField((TypeStruct *)in0,local_78,0,(int4 *)&fld);
    if (local_b0 == (TypeField *)0x0) {
      iVar3 = Datatype::getSize((Datatype *)in0);
      if ((ulong)(long)iVar3 <= uVar7) {
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"PTRSUB out of bounds into struct",&local_d1);
        LowlevelError::LowlevelError(pLVar5,(string *)local_d0);
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      std::__cxx11::ostringstream::ostringstream(local_250);
      this_01 = std::operator<<((ostream *)local_250,"field_0x");
      this_02 = (void *)std::ostream::operator<<(this_01,std::hex);
      std::ostream::operator<<(this_02,uVar7);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)&fieldtype,local_270);
      std::__cxx11::string::~string(local_270);
      _newoff = (Datatype *)0x0;
      fld._4_4_ = local_78;
      std::__cxx11::ostringstream::~ostringstream(local_250);
    }
    else {
      std::__cxx11::string::operator=((string *)&fieldtype,(string *)&local_b0->name);
      _newoff = local_b0->type;
      fld._4_4_ = local_b0->offset;
    }
    local_33 = 0;
    if ((_newoff != (Datatype *)0x0) &&
       (tVar2 = Datatype::getMetatype(_newoff), tVar2 == TYPE_ARRAY)) {
      local_33 = local_31 & 1;
      local_31 = 1;
    }
    if ((local_31 & 1) == 0) {
      if ((local_32 & 1) == 0) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&addressof,(PcodeOp *)ptype);
        PrintLanguage::pushOp(&this->super_PrintLanguage,&pointer_member,(PcodeOp *)ptype);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,_m,(PcodeOp *)ptype,local_38);
        PrintLanguage::Atom::Atom
                  (&local_2c0,(string *)&fieldtype,fieldtoken,no_color,(Datatype *)in0,fld._4_4_);
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_2c0);
      }
      else {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&addressof,(PcodeOp *)ptype);
        PrintLanguage::pushOp(&this->super_PrintLanguage,&object_member,(PcodeOp *)ptype);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,_m,(PcodeOp *)ptype,local_38 | 0x20)
        ;
        PrintLanguage::Atom::Atom
                  (&local_298,(string *)&fieldtype,fieldtoken,no_color,(Datatype *)in0,fld._4_4_);
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_298);
      }
    }
    else {
      if ((local_33 & 1) != 0) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,(PcodeOp *)ptype);
      }
      if ((local_32 & 1) == 0) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&pointer_member,(PcodeOp *)ptype);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,_m,(PcodeOp *)ptype,local_38);
        PrintLanguage::Atom::Atom
                  ((Atom *)&sb,(string *)&fieldtype,fieldtoken,no_color,(Datatype *)in0,fld._4_4_);
        PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&sb);
      }
      else {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&object_member,(PcodeOp *)ptype);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,_m,(PcodeOp *)ptype,local_38 | 0x20)
        ;
        PrintLanguage::Atom::Atom
                  (&local_2e8,(string *)&fieldtype,fieldtoken,no_color,(Datatype *)in0,fld._4_4_);
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_2e8);
      }
      if ((local_33 & 1) != 0) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,ptype);
      }
    }
    std::__cxx11::string::~string((string *)&fieldtype);
  }
  else {
    tVar2 = Datatype::getMetatype((Datatype *)in0);
    pVVar6 = in0;
    if (tVar2 == TYPE_SPACEBASE) {
      addr.offset = (uintb)TypeSpacebase::getMap((TypeSpacebase *)in0);
      this_03 = PcodeOp::getIn((PcodeOp *)ptype,1);
      uVar7 = Varnode::getOffset(this_03);
      uVar4 = Varnode::getSize(_m);
      PcodeOp::getAddr((PcodeOp *)ptype);
      TypeSpacebase::getAddress
                ((TypeSpacebase *)local_330,(uintb)pVVar6,(int4)uVar7,(Address *)(ulong)uVar4);
      bVar1 = Address::isInvalid((Address *)local_330);
      uVar7 = addr.offset;
      if (bVar1) {
        entry._6_1_ = 1;
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_350,"Unable to generate proper address from spacebase",
                   (allocator *)((long)&entry + 7));
        LowlevelError::LowlevelError(pLVar5,(string *)local_350);
        entry._6_1_ = 0;
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      Address::Address((Address *)&ct_1);
      local_360 = Scope::queryContainer((Scope *)uVar7,(Address *)local_330,1,(Address *)&ct_1);
      pDStack_378 = (Datatype *)0x0;
      local_33 = 0;
      if (local_360 != (SymbolEntry *)0x0) {
        pSVar8 = SymbolEntry::getSymbol(local_360);
        pDStack_378 = Symbol::getType(pSVar8);
        tVar2 = Datatype::getMetatype(pDStack_378);
        if (tVar2 == TYPE_ARRAY) {
          local_33 = local_31 & 1;
          local_31 = 1;
        }
        else {
          tVar2 = Datatype::getMetatype(pDStack_378);
          if (tVar2 == TYPE_CODE) {
            local_31 = 1;
          }
        }
      }
      if ((local_31 & 1) == 0) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&addressof,(PcodeOp *)ptype);
      }
      else if ((local_33 & 1) != 0) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,(PcodeOp *)ptype);
      }
      if (local_360 == (SymbolEntry *)0x0) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[6])(this,local_330,0,ptype);
      }
      else {
        uVar7 = Address::getOffset((Address *)local_330);
        this_04 = SymbolEntry::getAddr(local_360);
        uVar9 = Address::getOffset(this_04);
        iVar3 = SymbolEntry::getOffset(local_360);
        local_37c = ((int)uVar7 - (int)uVar9) + iVar3;
        if (local_37c == 0) {
          pSVar8 = SymbolEntry::getSymbol(local_360);
          (*(this->super_PrintLanguage)._vptr_PrintLanguage[5])(this,pSVar8,0,ptype);
        }
        else {
          pSVar8 = SymbolEntry::getSymbol(local_360);
          (*(this->super_PrintLanguage)._vptr_PrintLanguage[7])
                    (this,pSVar8,(ulong)local_37c,0,0,ptype,0);
        }
      }
      if ((local_33 & 1) != 0) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,ptype);
      }
    }
    else {
      tVar2 = Datatype::getMetatype((Datatype *)in0);
      if (tVar2 != TYPE_ARRAY) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])();
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3c8,"PTRSUB off of non structured pointer type",&local_3c9);
        LowlevelError::LowlevelError(pLVar5,(string *)local_3c8);
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      pVVar6 = PcodeOp::getIn((PcodeOp *)ptype,1);
      uVar7 = Varnode::getOffset(pVVar6);
      if (uVar7 != 0) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])();
        local_3a2 = 1;
        pLVar5 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3a0,"PTRSUB with non-zero offset into array type",&local_3a1);
        LowlevelError::LowlevelError(pLVar5,(string *)local_3a0);
        local_3a2 = 0;
        __cxa_throw(pLVar5,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      if ((local_31 & 1) == 0) {
        if ((local_32 & 1) == 0) {
          PrintLanguage::pushOp(&this->super_PrintLanguage,&dereference,(PcodeOp *)ptype);
          PrintLanguage::pushVnImplied(&this->super_PrintLanguage,_m,(PcodeOp *)ptype,local_38);
        }
        else {
          PrintLanguage::pushVnImplied(&this->super_PrintLanguage,_m,(PcodeOp *)ptype,local_38);
        }
      }
      else if ((local_32 & 1) == 0) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,(PcodeOp *)ptype);
        PrintLanguage::pushOp(&this->super_PrintLanguage,&dereference,(PcodeOp *)ptype);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,_m,(PcodeOp *)ptype,local_38);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,ptype);
      }
      else {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,(PcodeOp *)ptype);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,_m,(PcodeOp *)ptype,local_38);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,ptype);
      }
    }
  }
  return;
}

Assistant:

void PrintC::opPtrsub(const PcodeOp *op)

{
  TypePointer *ptype;
  Datatype *ct;
  const Varnode *in0;
  bool valueon,flex,arrayvalue;
  uint4 m;

  in0 = op->getIn(0);
  ptype = (TypePointer *)in0->getHigh()->getType();
  if (ptype->getMetatype() != TYPE_PTR) {
    clear();
    throw LowlevelError("PTRSUB off of non-pointer type");
  }
  ct = ptype->getPtrTo();
  m = mods & ~(print_load_value|print_store_value); // Current state of mods
  valueon = (mods & (print_load_value|print_store_value)) != 0;
  flex = isValueFlexible(in0);

  if (ct->getMetatype() == TYPE_STRUCT) {
    uintb suboff = op->getIn(1)->getOffset();	// How far into container
    suboff = AddrSpace::addressToByte(suboff,ptype->getWordSize());
    string fieldname;
    Datatype *fieldtype;
    int4 fieldoffset;
    int4 newoff;
    const TypeField *fld = ((TypeStruct *)ct)->getField((int4)suboff,0,&newoff);
    if (fld == (const TypeField *)0) {
      if (ct->getSize() <= suboff)
	throw LowlevelError("PTRSUB out of bounds into struct");
      // Try to match the Ghidra's default field name from DataTypeComponent.getDefaultFieldName
      ostringstream s;
      s << "field_0x" << hex << suboff;
      fieldname = s.str();
      fieldtype = (Datatype *)0;
      fieldoffset = suboff;
    }
    else {
      fieldname = fld->name;
      fieldtype = fld->type;
      fieldoffset = fld->offset;
    }
    arrayvalue = false;
    // The '&' is dropped if the output type is an array
    if ((fieldtype != (Datatype *)0)&&(fieldtype->getMetatype()==TYPE_ARRAY)) {
      arrayvalue = valueon;	// If printing value, use [0]
      valueon = true;		// Don't print &
    }
    
    if (!valueon) {		// Printing an ampersand
      if (flex) {		// EMIT  &( ).name
	pushOp(&addressof,op);
	pushOp(&object_member,op);
	pushVnImplied(in0,op,m | print_load_value);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      else {			// EMIT  &( )->name
	pushOp(&addressof,op);
	pushOp(&pointer_member,op);
	pushVnImplied(in0,op,m);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
    }
    else {			// Not printing an ampersand
      if (arrayvalue)
	pushOp(&subscript,op);
      if (flex) {		// EMIT  ( ).name
	pushOp(&object_member,op);
	pushVnImplied(in0,op,m | print_load_value);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      else {			// EMIT  ( )->name
	pushOp(&pointer_member,op);
	pushVnImplied(in0,op,m);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      if (arrayvalue)
	push_integer(0,4,false,(Varnode *)0,op);
    }
  }
  else if (ct->getMetatype() == TYPE_SPACEBASE) {
    TypeSpacebase *sb = (TypeSpacebase *)ct;
    Scope *scope = sb->getMap();
    Address addr = sb->getAddress(op->getIn(1)->getOffset(),in0->getSize(),op->getAddr());
    if (addr.isInvalid())
      throw LowlevelError("Unable to generate proper address from spacebase");
    SymbolEntry *entry = scope->queryContainer(addr,1,Address());
    Datatype *ct = (Datatype *)0;
    arrayvalue = false;
    if (entry != (SymbolEntry *)0) {
      ct = entry->getSymbol()->getType();
	   // The '&' is dropped if the output type is an array
      if (ct->getMetatype()==TYPE_ARRAY) {
	arrayvalue = valueon;	// If printing value, use [0]
	valueon = true;		// If printing ptr, don't use &
      }
      else if (ct->getMetatype()==TYPE_CODE)
	valueon = true;		// If printing ptr, don't use &
    }
    if (!valueon) {		// EMIT  &name
      pushOp(&addressof,op);
    }
    else {			// EMIT  name
      if (arrayvalue)
	pushOp(&subscript,op);
    }
    if (entry == (SymbolEntry *)0)
      pushUnnamedLocation(addr,(Varnode *)0,op);
    else {
      int4 off = (int4)(addr.getOffset() - entry->getAddr().getOffset()) + entry->getOffset();
      if (off == 0)
	pushSymbol(entry->getSymbol(),(Varnode *)0,op);
      else {
	// If this "value" is getting used as a storage location
	// we can't use a cast in its description, so turn off
	// casting when printing the partial symbol
	//	Datatype *exttype = ((mods & print_store_value)!=0) ? (Datatype *)0 : ct;
	pushPartialSymbol(entry->getSymbol(),off,0,(Varnode *)0,op,(Datatype *)0);
      }
    }
    if (arrayvalue)
      push_integer(0,4,false,(Varnode *)0,op);
  }
  else if (ct->getMetatype() == TYPE_ARRAY) {
    if (op->getIn(1)->getOffset() != 0) {
      clear();
      throw LowlevelError("PTRSUB with non-zero offset into array type");
    }
  // We are treating array as a structure
  // and this PTRSUB(*,0) represents changing
  // to treating it as a pointer to its element type
    if (!valueon) {
      if (flex) {		// EMIT  ( )
				// (*&struct->arrayfield)[i]
				// becomes struct->arrayfield[i]
	pushVnImplied(in0,op,m);
      }
      else {			// EMIT  *( )
	pushOp(&dereference,op);
	pushVnImplied(in0,op,m);
      }
    }
    else {
      if (flex) {		// EMIT  ( )[0]
	pushOp(&subscript,op);
	pushVnImplied(in0,op,m);
	push_integer(0,4,false,(Varnode *)0,op);
      }
      else {			// EMIT  (* )[0]
	pushOp(&subscript,op);
	pushOp(&dereference,op);
	pushVnImplied(in0,op,m);
	push_integer(0,4,false,(Varnode *)0,op);
      }
    }
  }
  else {
    clear();
    throw LowlevelError("PTRSUB off of non structured pointer type");
  }
}